

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int CVmObjString::gen_getp_case_conv
              (vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc,
              _func_wchar_t_ptr_wchar_t *conv)

{
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  byte *pbVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  _func_wchar_t_ptr_wchar_t *p_Var6;
  int iVar7;
  wchar_t wVar8;
  wchar_t *pwVar9;
  size_t sVar10;
  long lVar11;
  byte *pbVar12;
  long lVar13;
  size_t byte_size;
  byte *pbVar14;
  utf8_ptr local_58;
  vm_obj_id_t local_4c;
  _func_wchar_t_ptr_wchar_t *local_48;
  byte *local_40;
  vm_val_t *local_38;
  
  if (gen_getp_case_conv(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*,wchar_t_const*(*)(wchar_t))
      ::desc == '\0') {
    gen_getp_case_conv();
  }
  iVar7 = CVmObject::get_prop_check_argc(retval,argc,&gen_getp_case_conv::desc);
  pvVar5 = sp_;
  if (iVar7 == 0) {
    uVar1 = *(ushort *)str;
    local_40 = (byte *)(str + 2);
    byte_size = 0;
    uVar4 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar5->typ = self_val->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar2;
    pbVar14 = (byte *)(ulong)uVar1;
    pbVar3 = local_40;
    local_38 = retval;
    local_48 = conv;
    pbVar12 = pbVar14;
    while (pbVar12 != (byte *)0x0) {
      wVar8 = utf8_ptr::s_getch((char *)pbVar3);
      pwVar9 = (*local_48)(wVar8);
      if (pwVar9 == (wchar_t *)0x0) {
        lVar11 = 3 - (ulong)((uint)wVar8 < 0x800);
        if (wVar8 < L'\x80') {
          lVar11 = 1;
        }
      }
      else {
        wVar8 = *pwVar9;
        if (wVar8 == L'\0') {
          lVar11 = 0;
        }
        else {
          lVar11 = 0;
          do {
            pwVar9 = pwVar9 + 1;
            lVar13 = 3 - (ulong)((uint)wVar8 < 0x800);
            if (wVar8 < L'\x80') {
              lVar13 = 1;
            }
            lVar11 = lVar11 + lVar13;
            wVar8 = *pwVar9;
          } while (wVar8 != L'\0');
        }
      }
      byte_size = byte_size + lVar11;
      pbVar12 = pbVar3 + ((long)pbVar12 -
                         (long)(pbVar3 + (ulong)(((*pbVar3 >> 5 & 1) != 0) + 1 &
                                                (uint)(*pbVar3 >> 7) * 3) + 1));
      pbVar3 = pbVar3 + (ulong)(((*pbVar3 >> 5 & 1) != 0) + 1 & (uint)(*pbVar3 >> 7) * 3) + 1;
    }
    local_4c = create(0,byte_size);
    p_Var6 = local_48;
    local_58.p_ = (char *)(*(long *)((long)&G_obj_table_X.pages_[local_4c >> 0xc][local_4c & 0xfff].
                                            ptr_ + 8) + 2);
    pbVar3 = local_40;
    while (pbVar14 != (byte *)0x0) {
      wVar8 = utf8_ptr::s_getch((char *)pbVar3);
      pwVar9 = (*p_Var6)(wVar8);
      if (pwVar9 == (wchar_t *)0x0) {
        sVar10 = utf8_ptr::s_putch(local_58.p_,wVar8);
        local_58.p_ = local_58.p_ + sVar10;
      }
      else {
        sVar10 = utf8_ptr::setwcharsz(&local_58,pwVar9,byte_size);
      }
      byte_size = byte_size - sVar10;
      pbVar14 = pbVar3 + ((long)pbVar14 -
                         (long)(pbVar3 + (ulong)(((*pbVar3 >> 5 & 1) != 0) + 1 &
                                                (uint)(*pbVar3 >> 7) * 3) + 1));
      pbVar3 = pbVar3 + (ulong)(((*pbVar3 >> 5 & 1) != 0) + 1 & (uint)(*pbVar3 >> 7) * 3) + 1;
    }
    local_38->typ = VM_OBJ;
    (local_38->val).obj = local_4c;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::gen_getp_case_conv(
    VMG_ vm_val_t *retval, const vm_val_t *self_val,
    const char *str, uint *argc, const wchar_t *(*conv)(wchar_t))
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get my length */
    size_t srclen = vmb_get_len(str);

    /* leave the string on the stack as GC protection */
    G_stk->push(self_val);

    /* 
     *   Scan the string to determine how long the result will be.  The
     *   result won't necessarily be the same length as the original: some
     *   case conversions are 1:N characters, and even when they're 1:1, a
     *   two-byte character in the original could turn into a three-byte
     *   character in the result, and vice versa.
     */
    size_t dstlen;
    utf8_ptr srcp, dstp;
    size_t rem;
    for (dstlen = 0, srcp.set((char *)str + VMB_LEN), rem = srclen ;
         rem != 0 ; srcp.inc(&rem))
    {
        /* get the mapping for this character */
        wchar_t ch = srcp.getch();
        const wchar_t *u = conv(ch);

        /* add up the byte length of the mapping */
        dstlen += (u != 0
                   ? utf8_ptr::s_wstr_size(u)
                   : utf8_ptr::s_wchar_size(ch));
    }

    /* allocate the result string */
    vm_obj_id_t result_obj = CVmObjString::create(vmg_ FALSE, dstlen);

    /* get a pointer to the result buffer */
    dstp.set(((CVmObjString *)vm_objp(vmg_ result_obj))->cons_get_buf());

    /* write the string */
    for (srcp.set((char *)str + VMB_LEN), rem = srclen ;
         rem != 0 ; srcp.inc(&rem))
    {
        /* get the mapping for this character */
        wchar_t ch = srcp.getch();
        const wchar_t *u = conv(ch);

        /* put the character(s) */
        if (u != 0)
            dstlen -= dstp.setwcharsz(u, dstlen);
        else
            dstp.setch(ch, &dstlen);
    }

    /* return the value */
    retval->set_obj(result_obj);

    /* discard GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}